

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memwatch.c
# Opt level: O2

uint mwDrop_(uint kb,int type,int silent)

{
  mwGrabData *pmVar1;
  void *pvVar2;
  uint uVar3;
  uint uVar4;
  char *pcVar5;
  mwGrabData *__ptr;
  mwGrabData *pmVar6;
  
  uVar4 = 0;
  if (kb != 0 || mwGrabList != (mwGrabData *)0x0) {
    uVar4 = 60000;
    if (kb != 0) {
      uVar4 = kb;
    }
    pcVar5 = "no-mans-land";
    if (type == 0xfb) {
      pcVar5 = "grabbed";
    }
    pmVar1 = mwGrabList;
    pmVar6 = (mwGrabData *)0x0;
    uVar3 = uVar4;
    while (__ptr = pmVar1, uVar3 != 0) {
      if (__ptr == (mwGrabData *)0x0) {
        uVar4 = uVar4 - uVar3;
        if (silent != 0 || uVar4 == 0) {
          return uVar4;
        }
        mwWrite("dropped: all %s memory (%u kb)\n",pcVar5,(ulong)uVar4);
        goto LAB_001080b6;
      }
      if (__ptr->type == type) {
        pmVar1 = __ptr->next;
        if (pmVar6 != (mwGrabData *)0x0) {
          pmVar6->next = pmVar1;
        }
        if (mwGrabList == __ptr) {
          mwGrabList = pmVar1;
        }
        pvVar2 = mwTestMem(__ptr->blob,0x3f4,type);
        if (pvVar2 != (void *)0x0) {
          mwWrite("wild pointer: <%ld> %s memory hit at %p\n",mwCounter,pcVar5,pvVar2);
          mwFlush();
        }
        uVar3 = uVar3 - 1;
        mwGrabSize = mwGrabSize + -0x400;
        free(__ptr);
      }
      else {
        pmVar1 = __ptr->next;
        pmVar6 = __ptr;
      }
    }
    if (silent == 0) {
      mwWrite("dropped: %u kilobytes of %s memory\n",(ulong)uVar4,pcVar5);
LAB_001080b6:
      mwFlush();
    }
  }
  return uVar4;
}

Assistant:

static unsigned mwDrop_(unsigned kb, int type, int silent)
{
	unsigned i = kb;
	mwGrabData *gd, *tmp, *pr;
	const void *p;

	if (mwGrabList == NULL && kb == 0) {
		return 0;
	}
	if (!kb) {
		i = kb = 60000U;
	}

	pr = NULL;
	gd = mwGrabList;
	for (; kb;) {
		if (gd == NULL) {
			if (i - kb > 0 && !silent) {
				mwWrite("dropped: all %s memory (%u kb)\n", mwGrabType(type), i - kb);
				FLUSH();
			}
			return i - kb;
		}
		if (gd->type == type) {
			if (pr) {
				pr->next = gd->next;
			}
			kb --;
			tmp = gd;
			if (mwGrabList == gd) {
				mwGrabList = gd->next;
			}
			gd = gd->next;
			p = mwTestMem(tmp->blob, sizeof(tmp->blob), type);
			if (p != NULL) {
				mwWrite("wild pointer: <%ld> %s memory hit at %p\n",
						mwCounter, mwGrabType(type), p);
				FLUSH();
			}
			mwGrabSize -= (long) sizeof(mwGrabData);
			free(tmp);
		} else {
			pr = gd;
			gd = gd->next;
		}
	}
	if (!silent) {
		mwWrite("dropped: %u kilobytes of %s memory\n", i, mwGrabType(type));
		FLUSH();
	}
	return i;
}